

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
          (SingleBindingCase *this,Context *ctx,char *name,int flags)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  char *local_1c8 [4];
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<(&local_1a8,"draw test pattern");
  bVar7 = SUB41(flags & 1U,0);
  if ((flags & 1U) != 0) {
    std::operator<<(&local_1a8,", attribute offset (unaligned)");
  }
  if ((flags & 2U) != 0) {
    std::operator<<(&local_1a8,", attribute offset (aligned)");
  }
  if ((flags & 4U) != 0) {
    std::operator<<(&local_1a8,", 2 attributes");
  }
  if ((flags & 8U) != 0) {
    std::operator<<(&local_1a8,", 2 attributes (some components shared)");
  }
  if ((flags & 0x10U) != 0) {
    std::operator<<(&local_1a8,", buffer offset aligned");
  }
  if ((flags & 0x20U) != 0) {
    std::operator<<(&local_1a8,", buffer offset unaligned");
  }
  if ((flags & 0x40U) != 0) {
    std::operator<<(&local_1a8,", buffer stride unaligned");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  if ((flags & 3U) == 0) {
    bVar7 = (flags & 0x60U) != 0;
  }
  gles31::TestCase::TestCase((TestCase *)this,ctx,name,local_1c8[0]);
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BindingRenderCase_01e62be0;
  (this->super_BindingRenderCase).m_unalignedData = bVar7;
  (this->super_BindingRenderCase).m_vao = 0;
  (this->super_BindingRenderCase).m_program = (ShaderProgram *)0x0;
  std::__cxx11::string::~string((string *)local_1c8);
  uVar1 = 0x20;
  if ((flags & 0x10U) == 0) {
    uVar1 = (flags << 0x1a) >> 0x1f & 0x13;
  }
  uVar4 = 4 - (uVar1 & 3);
  if ((uVar1 & 3) == 0) {
    uVar4 = 0;
  }
  uVar2 = 3;
  if ((flags & 1U) == 0) {
    uVar2 = uVar4 & (flags << 0x1e) >> 0x1f;
  }
  uVar4 = 8;
  if ((flags & 8U) == 0) {
    uVar4 = -(uint)((flags & 4U) == 0) | 0x10;
  }
  uVar5 = uVar4 + 0x10;
  if (uVar4 + 0x10 < uVar2 + 0x10) {
    uVar5 = uVar2 + 0x10;
  }
  uVar6 = uVar5 & 3;
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SingleBindingCase_01e62b60;
  if ((flags & 0x40U) == 0) {
    iVar3 = 4 - uVar6;
    if (uVar6 == 0) {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = 0;
    if (uVar6 == 0) {
      iVar3 = 0xd;
    }
  }
  (this->m_spec).bufferOffset = uVar1;
  (this->m_spec).bufferStride = iVar3 + uVar5;
  (this->m_spec).positionAttrOffset = uVar2;
  (this->m_spec).colorAttrOffset = uVar4;
  (this->m_spec).hasColorAttr = (flags & 0xcU) != 0;
  this->m_buf = 0;
  return;
}

Assistant:

SingleBindingCase::SingleBindingCase (Context& ctx, const char* name, int flags)
	: BindingRenderCase	(ctx, name, genTestDescription(flags).c_str(), isDataUnaligned(flags))
	, m_spec			(genTestSpec(flags))
	, m_buf				(0)
{
	DE_ASSERT(!((flags & FLAG_ATTRIB_UNALIGNED) && (flags & FLAG_ATTRIB_ALIGNED)));
	DE_ASSERT(!((flags & FLAG_ATTRIB_ALIGNED) && (flags & FLAG_BUF_UNALIGNED_STRIDE)));

	DE_ASSERT(isDataUnaligned(flags));
}